

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall FDecalLib::ParseSlider(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FDecalAnimator *pFVar3;
  FString sliderName;
  FString local_48;
  int local_40;
  int local_3c;
  double local_38;
  
  local_48.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&local_48,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_38 = 0.0;
  local_3c = 0;
  local_40 = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"SlideStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      local_3c = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"SlideTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_40 = (int)(sc->Float * 35.0);
      }
      else {
        bVar1 = FScanner::Compare(sc,"DistX");
        if (bVar1) {
          FScanner::MustGetFloat(sc);
          Printf("DistX in slider decal %s is unsupported\n",local_48.Chars);
        }
        else {
          bVar1 = FScanner::Compare(sc,"DistY");
          if (bVar1) {
            FScanner::MustGetFloat(sc);
            local_38 = sc->Float;
          }
          else {
            FScanner::ScriptError(sc,"Unknown slider parameter \'%s\'",sc->String);
          }
        }
      }
    }
  }
  if ((local_38 != 0.0) || (NAN(local_38))) {
    pFVar3 = (FDecalAnimator *)operator_new(0x20);
    pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f68c0;
    (pFVar3->Name).Index = 0;
    iVar2 = FName::NameManager::FindName(&FName::NameData,local_48.Chars,false);
    (pFVar3->Name).Index = iVar2;
    pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f6c38;
    *(int *)&pFVar3->field_0xc = local_3c;
    *(int *)&pFVar3[1]._vptr_FDecalAnimator = local_40;
    *(double *)&pFVar3[1].Name = local_38;
    TArray<FDecalAnimator_*,_FDecalAnimator_*>::Grow
              (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,1);
    Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array
    [Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count] = pFVar3;
    Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count =
         Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count + 1;
  }
  FString::~FString(&local_48);
  return;
}

Assistant:

void FDecalLib::ParseSlider (FScanner &sc)
{
	FString sliderName;
	double distX = 0, distY = 0;
	int startTime = 0, takeTime = 0;

	sc.MustGetString ();
	sliderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			if ((/*distX |*/ distY) != 0)
			{
				FDecalSliderAnim *slider = new FDecalSliderAnim (sliderName);
				slider->SlideStart = startTime;
				slider->SlideTime = takeTime;
				/*slider->DistX = distX;*/
				slider->DistY = distY;
				Animators.Push (slider);
			}
			break;
		}
		else if (sc.Compare ("SlideStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("SlideTime"))
		{
			sc.MustGetFloat ();
			takeTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("DistX"))
		{
			sc.MustGetFloat ();	// must remain to avoid breaking definitions that accidentally used DistX
			Printf ("DistX in slider decal %s is unsupported\n", sliderName.GetChars());
		}
		else if (sc.Compare ("DistY"))
		{
			sc.MustGetFloat ();
			distY = sc.Float;
		}
		else
		{
			sc.ScriptError ("Unknown slider parameter '%s'", sc.String);
		}
	}
}